

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O1

Vec_Ptr_t * Vec_PtrAllocSimInfo(int nEntries,int nWords)

{
  void **ppvVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  
  ppvVar1 = (void **)malloc(((long)nWords * 4 + 8) * (long)nEntries);
  if (0 < nEntries) {
    ppvVar2 = ppvVar1 + nEntries;
    uVar4 = 0;
    do {
      ppvVar1[uVar4] = ppvVar2;
      uVar4 = uVar4 + 1;
      ppvVar2 = (void **)((long)ppvVar2 + (long)nWords * 4);
    } while ((uint)nEntries != uVar4);
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = nEntries;
  pVVar3->nCap = nEntries;
  pVVar3->pArray = ppvVar1;
  return pVVar3;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAllocSimInfo( int nEntries, int nWords )
{
    void ** pMemory;
    unsigned * pInfo;
    int i;
    pMemory = (void **)ABC_ALLOC( char, (sizeof(void *) + sizeof(unsigned) * nWords) * nEntries );
    pInfo = (unsigned *)(pMemory + nEntries);
    for ( i = 0; i < nEntries; i++ )
        pMemory[i] = pInfo + i * nWords;
    return Vec_PtrAllocArray( pMemory, nEntries );
}